

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O2

void __thiscall
yy::parser::basic_symbol<yy::parser::by_kind>::clear(basic_symbol<yy::parser::by_kind> *this)

{
  ulong uVar1;
  
  uVar1 = (ulong)(uint)(this->super_by_kind).kind_;
  if (uVar1 < 0x2c) {
    if ((0xd61c0000000U >> (uVar1 & 0x3f) & 1) == 0) {
      if ((0x70880UL >> (uVar1 & 0x3f) & 1) == 0) {
        if (uVar1 == 0xe) {
          value_type::destroy<ReferenceType>(&this->value);
        }
      }
      else {
        value_type::destroy<std::__cxx11::string>(&this->value);
      }
    }
    else {
      value_type::destroy<unsigned_long>(&this->value);
    }
  }
  (this->super_by_kind).kind_ = S_YYEMPTY;
  return;
}

Assistant:

void clear () YY_NOEXCEPT
      {
        // User destructor.
        symbol_kind_type yykind = this->kind ();
        basic_symbol<Base>& yysym = *this;
        (void) yysym;
        switch (yykind)
        {
       default:
          break;
        }

        // Value type destructor.
switch (yykind)
    {
      case symbol_kind::S_REF_OPEN: // "reference opening"
        value.template destroy< ReferenceType > ();
        break;

      case symbol_kind::S_arguments: // arguments
      case symbol_kind::S_argument_list: // argument_list
      case symbol_kind::S_parenthesized_arguments: // parenthesized_arguments
      case symbol_kind::S_quoted_argument: // quoted_argument
      case symbol_kind::S_quoted_element_list: // quoted_element_list
      case symbol_kind::S_unquoted_argument: // unquoted_argument
      case symbol_kind::S_reference: // reference
      case symbol_kind::S_var_reference_list: // var_reference_list
        value.template destroy< std::size_t > ();
        break;

      case symbol_kind::S_IDENTIFIER: // "command name"
      case symbol_kind::S_BRACKET_ARGUMENT: // "bracket argument"
      case symbol_kind::S_REF_VAR_NAME: // "variable name"
      case symbol_kind::S_QUOTED_STR: // "quoted argument chars"
      case symbol_kind::S_UNQUOTED_STR: // "unquoted argument chars"
        value.template destroy< std::string > ();
        break;

      default:
        break;
    }

        Base::clear ();
      }